

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

void hostcache_prune(Curl_hash *hostcache,long cache_timeout,time_t now)

{
  long local_30;
  hostcache_prune_data user;
  time_t now_local;
  long cache_timeout_local;
  Curl_hash *hostcache_local;
  
  local_30 = cache_timeout;
  user.cache_timeout = now;
  user.now = now;
  Curl_hash_clean_with_criterium(hostcache,&local_30,hostcache_timestamp_remove);
  return;
}

Assistant:

static void
hostcache_prune(struct Curl_hash *hostcache, long cache_timeout, time_t now)
{
  struct hostcache_prune_data user;

  user.cache_timeout = cache_timeout;
  user.now = now;

  Curl_hash_clean_with_criterium(hostcache,
                                 (void *) &user,
                                 hostcache_timestamp_remove);
}